

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  CppType CVar1;
  long lVar2;
  CppType CVar3;
  int32 iVar4;
  uint uVar5;
  int iVar6;
  LogMessage *pLVar7;
  size_t sVar8;
  string *psVar9;
  int64 iVar10;
  ulong uVar11;
  code *local_60 [7];
  FieldDescriptor *local_28;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_60[0] = FieldDescriptor::TypeOnceInit;
    local_28 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_60,&local_28);
  }
  CVar1 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
  CVar3 = MapKey::type(value);
  if (CVar1 != CVar3) {
    LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/wire_format.cc"
               ,0x5f7);
    pLVar7 = LogMessage::operator<<
                       ((LogMessage *)local_60,
                        "CHECK failed: (FieldDescriptor::TypeToCppType(field->type())) == (value.type()): "
                       );
    LogFinisher::operator=((LogFinisher *)&local_28,pLVar7);
    LogMessage::~LogMessage((LogMessage *)local_60);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_60[0] = FieldDescriptor::TypeOnceInit;
    local_28 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_60,&local_28);
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
  case 2:
  case 10:
  case 0xb:
  case 0xc:
  case 0xe:
    LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/wire_format.cc"
               ,0x5ff);
    pLVar7 = LogMessage::operator<<((LogMessage *)local_60,"Unsupported");
    LogFinisher::operator=((LogFinisher *)&local_28,pLVar7);
    goto LAB_003366cd;
  case 3:
    uVar11 = MapKey::GetInt64Value(value);
    goto LAB_0033676d;
  case 4:
    uVar11 = MapKey::GetUInt64Value(value);
    goto LAB_0033676d;
  case 5:
    uVar5 = MapKey::GetInt32Value(value);
    if ((int)uVar5 < 0) {
      return 10;
    }
    goto LAB_00336752;
  case 6:
  case 0x10:
    sVar8 = 8;
    break;
  case 7:
  case 0xf:
    sVar8 = 4;
    break;
  case 8:
    sVar8 = 1;
    break;
  case 9:
    psVar9 = MapKey::GetStringValue_abi_cxx11_(value);
    uVar5 = (uint)psVar9->_M_string_length | 1;
    iVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    sVar8 = (ulong)(iVar6 * 9 + 0x49U >> 6) + psVar9->_M_string_length;
    break;
  case 0xd:
    uVar5 = MapKey::GetUInt32Value(value);
LAB_00336752:
    iVar6 = 0x1f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    goto LAB_003367ca;
  case 0x11:
    iVar4 = MapKey::GetInt32Value(value);
    uVar5 = iVar4 >> 0x1f ^ iVar4 * 2 | 1;
    iVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    goto LAB_003367ca;
  case 0x12:
    iVar10 = MapKey::GetInt64Value(value);
    uVar11 = iVar10 >> 0x3f ^ iVar10 * 2;
LAB_0033676d:
    lVar2 = 0x3f;
    if ((uVar11 | 1) != 0) {
      for (; (uVar11 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar6 = (int)lVar2;
LAB_003367ca:
    sVar8 = (size_t)(iVar6 * 9 + 0x49U >> 6);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/wire_format.cc"
               ,0x61a);
    pLVar7 = LogMessage::operator<<((LogMessage *)local_60,"Cannot get here");
    LogFinisher::operator=((LogFinisher *)&local_28,pLVar7);
LAB_003366cd:
    LogMessage::~LogMessage((LogMessage *)local_60);
    sVar8 = 0;
  }
  return sVar8;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}